

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_source_panner.cpp
# Opt level: O1

shared_ptr<ear::PointSourcePanner> __thiscall ear::configurePolarPanner(ear *this,Layout *layout)

{
  int iVar1;
  internal_error *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  bool bVar3;
  _Bit_iterator _Var4;
  shared_ptr<ear::PointSourcePanner> sVar5;
  vector<bool,_std::allocator<bool>_> isLfe;
  vector<bool,_std::allocator<bool>_> local_88;
  string local_60;
  long *local_40;
  size_t local_38;
  long local_30 [2];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  
  Layout::isLfe(&local_88,layout);
  local_60._M_dataplus._M_p._0_1_ = 1;
  _Var4 = std::__find_if<std::_Bit_iterator,__gnu_cxx::__ops::_Iter_equals_val<bool_const>>
                    (local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,0,
                     local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p,
                     local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset);
  if ((_Var4.super__Bit_iterator_base._M_p ==
       local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_finish.super__Bit_iterator_base._M_p) &&
     (_Var4.super__Bit_iterator_base._M_offset ==
      local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
      .super__Bit_iterator_base._M_offset)) {
    checkScreenSpeakers(layout);
    Layout::name_abi_cxx11_(&local_60,layout);
    local_40 = local_30;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"0+2+0","");
    if (local_60._M_string_length == local_38) {
      if (local_60._M_string_length == 0) {
        bVar3 = true;
      }
      else {
        iVar1 = bcmp(local_60._M_dataplus._M_p,local_40,local_60._M_string_length);
        bVar3 = iVar1 == 0;
      }
    }
    else {
      bVar3 = false;
    }
    if (local_40 != local_30) {
      operator_delete(local_40,local_30[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    if (bVar3) {
      sVar5 = configureStereoPolarPanner(this,layout);
      _Var2 = sVar5.super___shared_ptr<ear::PointSourcePanner,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    }
    else {
      sVar5 = configureFullPolarPanner(this,layout);
      _Var2 = sVar5.super___shared_ptr<ear::PointSourcePanner,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    }
    if (local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
      operator_delete(local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                      (long)local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_end_of_storage -
                      (long)local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
      _Var2._M_pi = extraout_RDX;
    }
    sVar5.super___shared_ptr<ear::PointSourcePanner,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         _Var2._M_pi;
    sVar5.super___shared_ptr<ear::PointSourcePanner,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (shared_ptr<ear::PointSourcePanner>)
           sVar5.super___shared_ptr<ear::PointSourcePanner,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_00 = (internal_error *)__cxa_allocate_exception(0x10);
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_60,"lfe channel passed to point source panner","");
  internal_error::internal_error(this_00,&local_60);
  __cxa_throw(this_00,&internal_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::shared_ptr<PointSourcePanner> configurePolarPanner(
      const Layout& layout) {
    auto isLfe = layout.isLfe();
    if (find(isLfe.begin(), isLfe.end(), true) != isLfe.end()) {
      throw internal_error("lfe channel passed to point source panner");
    }

    checkScreenSpeakers(layout);

    if (layout.name() == std::string("0+2+0")) {
      return configureStereoPolarPanner(layout);
    } else {
      return configureFullPolarPanner(layout);
    }
  }